

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O0

uint32_t *
createDFDPackedShifted
          (int bigEndian,int numChannels,int *bits,int *shiftBits,int *channels,VkSuffix suffix)

{
  uint sampleNo;
  uint uVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int bitOffset_1;
  int totalBits_1;
  int sampleCounter_1;
  int secondSampleBits;
  int firstSampleBits;
  int thisChannel;
  int sampleCounter;
  int numSamples;
  int BEMask;
  int bitOffset;
  int channelCounter;
  int beChannelStart [4];
  int bitChannel [32];
  int totalBits;
  uint32_t *DFD;
  channels_infotype in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int offset;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int iVar3;
  undefined4 in_stack_ffffffffffffff34;
  int iVar4;
  int iVar5;
  uint auStack_c8 [2];
  int in_stack_ffffffffffffff40;
  VkSuffix in_stack_ffffffffffffff48;
  uint local_34;
  uint32_t *local_30;
  
  if (in_ESI == 6) {
    local_30 = writeHeader(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[10] = 0x2100;
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[0xd] = 0xf;
    local_30[0xe] = 0x1f;
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[0x12] = 0x2100;
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[0x15] = 0xf;
    local_30[0x16] = 0x1f;
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[0x1a] = 0x2100;
    writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff48);
    local_30[0x1d] = 0xf;
    local_30[0x1e] = 0x1f;
  }
  else if (in_EDI == 0) {
    iVar4 = 0;
    for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      iVar4 = *(int *)(in_RCX + (long)iVar3 * 4) + *(int *)(in_RDX + (long)iVar3 * 4) + iVar4;
    }
    local_30 = writeHeader(iVar3,iVar4,0,in_stack_ffffffffffffff08);
    for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
      writeSample((uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                  in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,
                  in_stack_ffffffffffffff48);
    }
  }
  else {
    local_34 = 0;
    iVar3 = 0;
    for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
      auStack_c8[iVar4] = local_34;
      local_34 = *(int *)(in_RCX + (long)iVar4 * 4) + *(int *)(in_RDX + (long)iVar4 * 4) + local_34;
    }
    sampleNo = local_34 - 1 & 0x18;
    iVar4 = in_ESI;
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      uVar1 = *(int *)(in_RCX + (long)iVar5 * 4) + iVar3;
      *(int *)(&stack0xffffffffffffff48 + (long)(int)(uVar1 ^ sampleNo) * 4) = iVar5;
      if (((uVar1 + *(int *)(in_RDX + (long)iVar5 * 4)) - 1 & 0xfffffff8) != (uVar1 & 0xfffffff8)) {
        *(int *)(&stack0xffffffffffffff48 +
                (long)(int)((uVar1 + *(int *)(in_RDX + (long)iVar5 * 4)) - 1 & 0xfffffff8 ^ sampleNo
                           ) * 4) = iVar5;
        iVar4 = iVar4 + 1;
      }
      iVar3 = *(int *)(in_RDX + (long)iVar5 * 4) + uVar1;
    }
    local_30 = writeHeader(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    iVar3 = 0;
    uVar1 = 0;
    while ((int)uVar1 < (int)local_34) {
      if (*(int *)(&stack0xffffffffffffff48 + (long)(int)uVar1 * 4) == -1) {
        uVar1 = uVar1 + 8 & 0xfffffff8;
      }
      else {
        offset = *(int *)(&stack0xffffffffffffff48 + (long)(int)uVar1 * 4);
        if ((auStack_c8[offset] ^ sampleNo) == uVar1) {
          iVar3 = iVar3 + 1;
          writeSample((uint32_t *)CONCAT44(iVar5,uVar1),sampleNo,iVar4,iVar3,offset,
                      in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48)
          ;
          uVar1 = *(int *)(in_RDX + (long)offset * 4) + uVar1;
        }
        else {
          in_stack_ffffffffffffff1c = 8 - (auStack_c8[offset] & 7);
          iVar2 = *(int *)(in_RDX + (long)offset * 4) - in_stack_ffffffffffffff1c;
          iVar3 = iVar3 + 1;
          writeSample((uint32_t *)CONCAT44(iVar5,uVar1),sampleNo,iVar4,iVar3,offset,
                      in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48)
          ;
          *(undefined4 *)(&stack0xffffffffffffff48 + (long)(int)(auStack_c8[offset] ^ sampleNo) * 4)
               = 0xffffffff;
          iVar3 = iVar3 + 1;
          writeSample((uint32_t *)CONCAT44(iVar5,uVar1),sampleNo,iVar4,iVar3,offset,
                      in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48)
          ;
          uVar1 = iVar2 + uVar1;
        }
      }
    }
  }
  return local_30;
}

Assistant:

uint32_t *createDFDPackedShifted(int bigEndian, int numChannels,
                                 int bits[], int shiftBits[], int channels[],
                                 enum VkSuffix suffix)
{
    uint32_t *DFD = 0;
    if (numChannels == 6) {
        /* Special case E5B9G9R9 */
        DFD = writeHeader(numChannels, 4, s_UFLOAT, i_COLOR);
        writeSample(DFD, 0, 0,
                    9, 0,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 0, SAMPLEUPPER, 8448);
        writeSample(DFD, 1, 0 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 1, SAMPLEUPPER, 31);
        writeSample(DFD, 2, 1,
                    9, 9,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 2, SAMPLEUPPER, 8448);
        writeSample(DFD, 3, 1 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 3, SAMPLEUPPER, 31);
        writeSample(DFD, 4, 2,
                    9, 18,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 4, SAMPLEUPPER, 8448);
        writeSample(DFD, 5, 2 | KHR_DF_SAMPLE_DATATYPE_EXPONENT,
                    5, 27,
                    1, 1, s_UNORM);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLELOWER, 15);
        KHR_DFDSETSVAL((DFD+1), 5, SAMPLEUPPER, 31);
    } else if (bigEndian) {
        /* No packed format is larger than 32 bits. */
        /* No packed channel crosses more than two bytes. */
        int totalBits = 0;
        int bitChannel[32];
        int beChannelStart[4];
        int channelCounter;
        int bitOffset = 0;
        int BEMask;
        int numSamples = numChannels;
        int sampleCounter;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            beChannelStart[channelCounter] = totalBits;
            totalBits += shiftBits[channelCounter] + bits[channelCounter];
        }
        BEMask = (totalBits - 1) & 0x18;
        for (channelCounter = 0; channelCounter < numChannels; ++channelCounter) {
            bitOffset += shiftBits[channelCounter];
            bitChannel[bitOffset ^ BEMask] = channelCounter;
            if (((bitOffset + bits[channelCounter] - 1) & ~7) != (bitOffset & ~7)) {
                /* Continuation sample */
                bitChannel[((bitOffset + bits[channelCounter] - 1) & ~7) ^ BEMask] = channelCounter;
                numSamples++;
            }
            bitOffset += bits[channelCounter];
        }
        DFD = writeHeader(numSamples, totalBits >> 3, suffix, i_COLOR);

        sampleCounter = 0;
        for (bitOffset = 0; bitOffset < totalBits;) {
            if (bitChannel[bitOffset] == -1) {
                /* Done this bit, so this is the lower half of something. */
                /* We must therefore jump to the end of the byte and continue. */
                bitOffset = (bitOffset + 8) & ~7;
            } else {
                /* Start of a channel? */
                int thisChannel = bitChannel[bitOffset];
                if ((beChannelStart[thisChannel] ^ BEMask) == bitOffset) {
                    /* Must be just one sample if we hit it first. */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                    bits[thisChannel], bitOffset,
                                    1, 1, suffix);
                    bitOffset += bits[thisChannel];
                } else {
                    /* Two samples. Move to the end of the first one we hit when we're done. */
                    int firstSampleBits = 8 - (beChannelStart[thisChannel] & 0x7); /* Rest of the byte */
                    int secondSampleBits = bits[thisChannel] - firstSampleBits; /* Rest of the bits */
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                firstSampleBits, beChannelStart[thisChannel] ^ BEMask,
                                0, 1, suffix);
                    /* Mark that we've already handled this sample */
                    bitChannel[beChannelStart[thisChannel] ^ BEMask] = -1;
                    writeSample(DFD, sampleCounter++, channels[thisChannel],
                                secondSampleBits, bitOffset,
                                1, 0, suffix);
                    bitOffset += secondSampleBits;
                }
            }
        }

    } else { /* Little-endian */

        int sampleCounter;
        int totalBits = 0;
        int bitOffset = 0;
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            totalBits += shiftBits[sampleCounter] + bits[sampleCounter];
        }

        /* One sample per channel */
        DFD = writeHeader(numChannels, totalBits >> 3, suffix, i_COLOR);
        for (sampleCounter = 0; sampleCounter < numChannels; ++sampleCounter) {
            bitOffset += shiftBits[sampleCounter];
            writeSample(DFD, sampleCounter, channels[sampleCounter],
                        bits[sampleCounter], bitOffset,
                        1, 1, suffix);
            bitOffset += bits[sampleCounter];
        }
    }
    return DFD;
}